

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

void __thiscall
AlternativeLoader::AlternativeLoader(AlternativeLoader *this,AlternativeLoader *toCopy)

{
  string *psVar1;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->pDominationMapFile = psVar1;
  std::__cxx11::string::_M_assign((string *)psVar1);
  return;
}

Assistant:

AlternativeLoader::AlternativeLoader(const AlternativeLoader &toCopy) {
    pDominationMapFile = new std::string();
    *pDominationMapFile = *toCopy.pDominationMapFile;
}